

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O0

_Bool pop3_endofresp(Curl_easy *data,connectdata *conn,char *line,size_t len,int *resp)

{
  int iVar1;
  pop3_conn *pop3c;
  int *resp_local;
  size_t len_local;
  char *line_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  if ((len < 4) || (*(int *)line != 0x5252452d)) {
    if ((conn->proto).pop3c.state == POP3_CAPA) {
      if ((len == 0) || (*line != '.')) {
        *resp = 0x2a;
      }
      else {
        *resp = 0x2b;
      }
      data_local._7_1_ = true;
    }
    else {
      if ((2 < len) && (iVar1 = memcmp("+OK",line,3), iVar1 == 0)) {
        *resp = 0x2b;
        return true;
      }
      if ((len == 0) || (*line != '+')) {
        data_local._7_1_ = false;
      }
      else {
        *resp = 0x2a;
        data_local._7_1_ = true;
      }
    }
  }
  else {
    *resp = 0x2d;
    data_local._7_1_ = true;
  }
  return data_local._7_1_;
}

Assistant:

static bool pop3_endofresp(struct Curl_easy *data, struct connectdata *conn,
                           char *line, size_t len, int *resp)
{
  struct pop3_conn *pop3c = &conn->proto.pop3c;
  (void)data;

  /* Do we have an error response? */
  if(len >= 4 && !memcmp("-ERR", line, 4)) {
    *resp = '-';

    return TRUE;
  }

  /* Are we processing CAPA command responses? */
  if(pop3c->state == POP3_CAPA) {
    /* Do we have the terminating line? */
    if(len >= 1 && line[0] == '.')
      /* Treat the response as a success */
      *resp = '+';
    else
      /* Treat the response as an untagged continuation */
      *resp = '*';

    return TRUE;
  }

  /* Do we have a success response? */
  if(len >= 3 && !memcmp("+OK", line, 3)) {
    *resp = '+';

    return TRUE;
  }

  /* Do we have a continuation response? */
  if(len >= 1 && line[0] == '+') {
    *resp = '*';

    return TRUE;
  }

  return FALSE; /* Nothing for us */
}